

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::SSDPRequester::PollLANInfo(SSDPRequester *this)

{
  LANInfo *info;
  pointer pbVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  bool bVar4;
  bool updated;
  Result lanResult;
  error_code ec;
  address multicastIP;
  bool local_1e9;
  Result local_1e8;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  info = &this->LAN;
  local_1e9 = false;
  UpdateLANInfo((gateway *)&local_1e8,info,&local_1e9);
  if (local_1e8.Error != (ErrorResult *)0x0) {
    Result::ToJson_abi_cxx11_(&local_1e0,&local_1e8);
    if (DAT_001b8e60 < 4) {
      local_1a0._0_8_ = ModuleLogger;
      local_1a0._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,DAT_001b8e90,DAT_001b8e98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Could not get LAN info: ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 (char *)CONCAT44(local_1e0._M_dataplus._M_p._4_4_,local_1e0._M_dataplus._M_p._0_4_)
                 ,local_1e0._M_string_length);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e0._M_dataplus._M_p._4_4_,local_1e0._M_dataplus._M_p._0_4_) !=
        &local_1e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e0._M_dataplus._M_p._4_4_,local_1e0._M_dataplus._M_p._0_4_));
    }
  }
  if (local_1e9 != true) goto LAB_00139854;
  if ((info->Gateway).type_ == ipv4) {
    bVar4 = (this->LAN).Gateway.ipv4_address_.addr_.s_addr == 0;
  }
  else {
    bVar2 = false;
    bVar4 = false;
    if ((((*(long *)&(this->LAN).Gateway.ipv6_address_.addr_.__in6_u == 0) &&
         (bVar4 = bVar2,
         (int)*(undefined8 *)((long)&(this->LAN).Gateway.ipv6_address_.addr_.__in6_u + 8) == 0)) &&
        ((this->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] == '\0' &&
         (this->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == '\0')) &&
       ((this->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == '\0')) {
      bVar4 = (this->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\0';
    }
  }
  this->HaveSeenAGatewayAddress = (bool)(this->HaveSeenAGatewayAddress | bVar4 ^ 1U);
  asio::ip::address::to_string_abi_cxx11_(&local_1e0,&info->Gateway);
  asio::ip::address::to_string_abi_cxx11_(&local_1c0,&(this->LAN).Localhost);
  if (DAT_001b8e60 < 3) {
    local_1a0._0_8_ = ModuleLogger;
    local_1a0._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,DAT_001b8e90,DAT_001b8e98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Detected new LAN configuration. Gateway: ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               (char *)CONCAT44(local_1e0._M_dataplus._M_p._4_4_,local_1e0._M_dataplus._M_p._0_4_),
               local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," LocalIP: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e0._M_dataplus._M_p._4_4_,local_1e0._M_dataplus._M_p._0_4_) !=
      &local_1e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e0._M_dataplus._M_p._4_4_,local_1e0._M_dataplus._M_p._0_4_));
  }
  if (this->HaveSeenAGatewayAddress != true) goto LAB_00139854;
  if ((info->Gateway).type_ == ipv4) {
    if ((this->LAN).Gateway.ipv4_address_.addr_.s_addr == 0) goto LAB_00139854;
  }
  else if ((this->LAN).Gateway.ipv6_address_.addr_.__in6_u ==
           (anon_union_16_3_a3f0114d_for___in6_u)0x0) goto LAB_00139854;
  local_1e0._M_dataplus._M_p._0_4_ = 0;
  local_1e0._M_string_length = std::_V2::system_category();
  asio::ip::make_address((address *)local_1a0,"239.255.255.250",(error_code *)&local_1e0);
  pbVar1 = (this->SSDPAddresses).
           super__Vector_base<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->SSDPAddresses).
      super__Vector_base<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    (this->SSDPAddresses).
    super__Vector_base<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  }
  std::
  vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
  ::emplace_back<asio::ip::address_const&,unsigned_short_const&>
            ((vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
              *)&this->SSDPAddresses,(address *)local_1a0,&kPortSSDP);
  if ((info->Gateway).type_ == ipv4) {
    if ((this->LAN).Gateway.ipv4_address_.addr_.s_addr != 0) goto LAB_00139830;
  }
  else if ((this->LAN).Gateway.ipv6_address_.addr_.__in6_u !=
           (anon_union_16_3_a3f0114d_for___in6_u)0x0) {
LAB_00139830:
    std::
    vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
    ::emplace_back<asio::ip::address&,unsigned_short_const&>
              ((vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
                *)&this->SSDPAddresses,&info->Gateway,&kPortSSDP);
  }
  this->AttemptsRemaining = 3;
  StateMachine::OnLANChange(this->State);
LAB_00139854:
  Result::~Result(&local_1e8);
  return;
}

Assistant:

void SSDPRequester::PollLANInfo()
{
    bool updated = false;
    Result lanResult = UpdateLANInfo(LAN, updated);
    if (lanResult.IsFail()) {
        ModuleLogger.Warning("Could not get LAN info: ", lanResult.ToJson());
    }
    if (!updated) {
        return;
    }
    HaveSeenAGatewayAddress |= !LAN.Gateway.is_unspecified();

    ModuleLogger.Info("Detected new LAN configuration. Gateway: ", LAN.Gateway.to_string(),
        " LocalIP: ", LAN.Localhost.to_string());

    // If network is not possibly up
    if (IsNetworkDefinitelyDown()) {
        return;
    }

    // Convert IP string to IP address
    asio::error_code ec;
    const asio::ip::address multicastIP = \
        asio::ip::make_address(kUPnPMulticastAddress, ec);
    TONK_DEBUG_ASSERT(!ec); // Should never happen

    // Send to multicast address
    SSDPAddresses.clear();
    SSDPAddresses.emplace_back(multicastIP, kPortSSDP);

    // If we were able to get the LAN gateway address:
    if (!LAN.Gateway.is_unspecified()) {
        SSDPAddresses.emplace_back(LAN.Gateway, kPortSSDP);
    }

    // Restart SSDP scanning
    BeginSearch();

    // Allow state machine to react to LAN change
    State->OnLANChange();
}